

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectCis(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vSupp)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  vSupp->nSize = 0;
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  uVar4 = 0;
  uVar5 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pGVar1 = Gia_ManObj(p,pNodes[uVar4]);
    uVar2 = *(ulong *)pGVar1 & 0x1fffffff;
    uVar3 = 0;
    if (uVar2 != 0x1fffffff) {
      uVar3 = -uVar2;
    }
    Gia_ManCollectCis_rec(p,pGVar1 + (uVar3 & (long)(int)*(ulong *)pGVar1 >> 0x1f),vSupp);
  }
  return;
}

Assistant:

void Gia_ManCollectCis( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int i; 
    Vec_IntClear( vSupp );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectCis_rec( p, Gia_ObjFanin0(pObj), vSupp );
        else
            Gia_ManCollectCis_rec( p, pObj, vSupp );
    }
}